

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ResultBuilder::ExprComponents::ExprComponents(ExprComponents *this)

{
  this->testFalse = false;
  (this->lhs)._M_dataplus._M_p = (pointer)&(this->lhs).field_2;
  (this->lhs)._M_string_length = 0;
  (this->lhs).field_2._M_local_buf[0] = '\0';
  (this->rhs)._M_dataplus._M_p = (pointer)&(this->rhs).field_2;
  (this->rhs)._M_string_length = 0;
  (this->rhs).field_2._M_local_buf[0] = '\0';
  (this->op)._M_dataplus._M_p = (pointer)&(this->op).field_2;
  (this->op)._M_string_length = 0;
  (this->op).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ExprComponents() : testFalse( false ) {}